

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_SEND_TCP_DATA_check(void)

{
  int32_t iVar1;
  uint8_t buf4 [5];
  uint8_t buf5 [6];
  uint8_t buf3 [11];
  uint8_t buf2 [11];
  uint8_t buf1 [11];
  PipeMsg msg;
  uint8_t local_168 [8];
  uint8_t local_160 [8];
  uint8_t local_158 [16];
  uint8_t local_148 [16];
  uint8_t local_138 [16];
  PipeMsg local_128;
  
  MsgHelper::initMsg(&local_128,SEND_TCP_DATA);
  local_138[0] = '\x03';
  local_138[1] = '\x02';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\n';
  local_138[6] = '\x01';
  local_138[7] = '\x02';
  local_138[8] = '\x03';
  local_138[9] = '\x04';
  local_138[10] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(local_138,0xb,&local_128);
  if (iVar1 != 10) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xf5,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_128);
  local_148[0] = '\x03';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = '\0';
  local_148[5] = '\n';
  local_148[6] = '\x01';
  local_148[7] = '\x02';
  local_148[8] = '\x03';
  local_148[9] = '\x04';
  local_148[10] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(local_148,0xb,&local_128);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xfa,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_128);
  local_158[0] = '\x03';
  local_158[1] = '\x02';
  local_158[2] = '\0';
  local_158[3] = '\0';
  local_158[4] = '\0';
  local_158[5] = '\x06';
  local_158[6] = '\x01';
  local_158[7] = '\x02';
  local_158[8] = '\x03';
  local_158[9] = '\x04';
  local_158[10] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(local_158,0xb,&local_128);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xff,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_128);
  builtin_memcpy(local_168,"\x03\x02\x03\x03\x03",5);
  iVar1 = MsgHelper::deserializeMsg(local_168,5,&local_128);
  if (iVar1 == 0) {
    MsgHelper::destroyMsg(&local_128);
    builtin_memcpy(local_160,"\x03\x02\x03\x13#3",6);
    iVar1 = MsgHelper::deserializeMsg(local_160,6,&local_128);
    if (iVar1 == -1) {
      MsgHelper::destroyMsg(&local_128);
      return;
    }
    __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x108,"void test_SEND_TCP_DATA_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x103,"void test_SEND_TCP_DATA_check()");
}

Assistant:

void test_SEND_TCP_DATA_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::SEND_TCP_DATA);
	
	const uint8_t buf1[] = {0x03, 0x02, 0x00, 0x00, 0x00, 0x0A, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 10);
	MsgHelper::destroyMsg(&msg);
	
	// error: method(0x00)
	const uint8_t buf2[] = {0x03, 0x00, 0x00, 0x00, 0x00, 0x0A, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x06) < min
	const uint8_t buf3[] = {0x03, 0x02, 0x00, 0x00, 0x00, 0x06, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf4[] = {0x03, 0x02, 0x03, 0x03, 0x03};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x03131233) overflow
	const uint8_t buf5[] = {0x03, 0x02, 0x03, 0x13, 0x23, 0x33};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
}